

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publications.cpp
# Opt level: O1

void __thiscall
helics::Publication::Publication
          (Publication *this,InterfaceVisibility locality,ValueFederate *valueFed,string_view key,
          string_view type,string_view units)

{
  Core **ppCVar1;
  string *this_00;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  size_t sVar11;
  bool bVar12;
  bool bVar13;
  undefined2 uVar14;
  Publication *pPVar15;
  anon_class_8_1_8991fb9c_conflict local_38;
  
  ppCVar1 = &(this->super_Interface).mCore;
  (this->super_Interface).mCore = (Core *)0x0;
  (this->super_Interface).handle.hid = -1700000000;
  this_00 = &(this->super_Interface).mName;
  (this->super_Interface).mName._M_dataplus._M_p = (pointer)&(this->super_Interface).mName.field_2;
  (this->super_Interface).mName._M_string_length = 0;
  (this->super_Interface).mName.field_2._M_local_buf[0] = '\0';
  (this->super_Interface)._vptr_Interface = (_func_int **)&PTR__Publication_004db158;
  this->fed = (ValueFederate *)0x0;
  this->referenceIndex = -1;
  this->dataReference = (void *)0x0;
  this->delta = -1.0;
  this->pubType = HELICS_ANY;
  this->changeDetectionEnabled = false;
  this->disableAssign = false;
  *(__index_type *)
   ((long)&(this->prevValue).
           super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
           .
           super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
           .
           super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
           .
           super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
           .
           super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
           .
           super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
   + 0x28) = '\0';
  this->customTypeHash = 0;
  *(undefined8 *)
   &(this->prevValue).
    super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
    .
    super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    .
    super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    .
    super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    .
    super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    .
    super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    ._M_u = 0;
  (this->pubUnits)._M_dataplus._M_p = (pointer)&(this->pubUnits).field_2;
  (this->pubUnits)._M_string_length = 0;
  (this->pubUnits).field_2._M_local_buf[0] = '\0';
  (this->pubUnitType).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->pubUnitType).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38.this =
       (_Copy_assign_base<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
        *)&this->prevValue;
  if (locality == GLOBAL) {
    pPVar15 = helics::ValueFederate::registerGlobalPublication(valueFed,key,type,units);
    (this->super_Interface).handle.hid = (pPVar15->super_Interface).handle.hid;
    *ppCVar1 = (pPVar15->super_Interface).mCore;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &(pPVar15->super_Interface).mName);
    uVar2 = *(undefined4 *)&pPVar15->fed;
    uVar3 = *(undefined4 *)((long)&pPVar15->fed + 4);
    iVar4 = pPVar15->referenceIndex;
    uVar5 = *(undefined4 *)&pPVar15->field_0x44;
    uVar6 = *(undefined4 *)&pPVar15->dataReference;
    uVar7 = *(undefined4 *)((long)&pPVar15->dataReference + 4);
    uVar8 = *(undefined4 *)&pPVar15->delta;
    uVar9 = *(undefined4 *)((long)&pPVar15->delta + 4);
    bVar12 = pPVar15->changeDetectionEnabled;
    bVar13 = pPVar15->disableAssign;
    uVar14 = *(undefined2 *)&pPVar15->field_0x5e;
    sVar11 = pPVar15->customTypeHash;
    uVar10 = *(undefined4 *)((long)&pPVar15->customTypeHash + 4);
    this->pubType = pPVar15->pubType;
    this->changeDetectionEnabled = bVar12;
    this->disableAssign = bVar13;
    *(undefined2 *)&this->field_0x5e = uVar14;
    *(int *)&this->customTypeHash = (int)sVar11;
    *(undefined4 *)((long)&this->customTypeHash + 4) = uVar10;
    *(undefined4 *)&this->dataReference = uVar6;
    *(undefined4 *)((long)&this->dataReference + 4) = uVar7;
    *(undefined4 *)&this->delta = uVar8;
    *(undefined4 *)((long)&this->delta + 4) = uVar9;
    *(undefined4 *)&this->fed = uVar2;
    *(undefined4 *)((long)&this->fed + 4) = uVar3;
    this->referenceIndex = iVar4;
    *(undefined4 *)&this->field_0x44 = uVar5;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>_&>
      ::_S_vtable._M_arr
      [(long)(char)*(__index_type *)
                    ((long)&(pPVar15->prevValue).
                            super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                            .
                            super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                            .
                            super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                            .
                            super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                            .
                            super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                            .
                            super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                    + 0x28) + 1]._M_data)(&local_38,&pPVar15->prevValue);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->pubUnits,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &pPVar15->pubUnits);
  }
  else {
    pPVar15 = helics::ValueFederate::registerPublication(valueFed,key,type,units);
    (this->super_Interface).handle.hid = (pPVar15->super_Interface).handle.hid;
    *ppCVar1 = (pPVar15->super_Interface).mCore;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &(pPVar15->super_Interface).mName);
    uVar2 = *(undefined4 *)&pPVar15->fed;
    uVar3 = *(undefined4 *)((long)&pPVar15->fed + 4);
    iVar4 = pPVar15->referenceIndex;
    uVar5 = *(undefined4 *)&pPVar15->field_0x44;
    uVar6 = *(undefined4 *)&pPVar15->dataReference;
    uVar7 = *(undefined4 *)((long)&pPVar15->dataReference + 4);
    uVar8 = *(undefined4 *)&pPVar15->delta;
    uVar9 = *(undefined4 *)((long)&pPVar15->delta + 4);
    bVar12 = pPVar15->changeDetectionEnabled;
    bVar13 = pPVar15->disableAssign;
    uVar14 = *(undefined2 *)&pPVar15->field_0x5e;
    sVar11 = pPVar15->customTypeHash;
    uVar10 = *(undefined4 *)((long)&pPVar15->customTypeHash + 4);
    this->pubType = pPVar15->pubType;
    this->changeDetectionEnabled = bVar12;
    this->disableAssign = bVar13;
    *(undefined2 *)&this->field_0x5e = uVar14;
    *(int *)&this->customTypeHash = (int)sVar11;
    *(undefined4 *)((long)&this->customTypeHash + 4) = uVar10;
    *(undefined4 *)&this->dataReference = uVar6;
    *(undefined4 *)((long)&this->dataReference + 4) = uVar7;
    *(undefined4 *)&this->delta = uVar8;
    *(undefined4 *)((long)&this->delta + 4) = uVar9;
    *(undefined4 *)&this->fed = uVar2;
    *(undefined4 *)((long)&this->fed + 4) = uVar3;
    this->referenceIndex = iVar4;
    *(undefined4 *)&this->field_0x44 = uVar5;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>_&>
      ::_S_vtable._M_arr
      [(long)(char)*(__index_type *)
                    ((long)&(pPVar15->prevValue).
                            super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                            .
                            super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                            .
                            super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                            .
                            super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                            .
                            super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                            .
                            super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                    + 0x28) + 1]._M_data)(&local_38,&pPVar15->prevValue);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->pubUnits,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &pPVar15->pubUnits);
  }
  (this->pubUnitType).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (pPVar15->pubUnitType).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &(this->pubUnitType).
              super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &(pPVar15->pubUnitType).
              super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

Publication::Publication(InterfaceVisibility locality,
                         ValueFederate* valueFed,
                         std::string_view key,
                         std::string_view type,
                         std::string_view units)
{
    try {
        if (locality == InterfaceVisibility::GLOBAL) {
            operator=(valueFed->registerGlobalPublication(key, type, units));
        } else {
            operator=(valueFed->registerPublication(key, type, units));
        }
    }
    catch (const RegistrationFailure&) {
        operator=(valueFed->getPublication(key));
        if (!isValid()) {
            throw;
        }
    }
}